

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O0

void rlogin_startup(Rlogin *rlogin,SeatPromptResult spr,char *ruser)

{
  SeatPromptResult spr_00;
  undefined1 auVar1 [24];
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 in_stack_ffffffffffffff88;
  Socket *pSVar5;
  char *err;
  char *p;
  char *pcStack_18;
  char z;
  char *ruser_local;
  Rlogin *rlogin_local;
  
  p._7_1_ = 0;
  pcStack_18 = ruser;
  ruser_local = (char *)rlogin;
  if (spr.kind == SPRK_USER_ABORT) {
    sk_close(rlogin->s);
    ruser_local[0] = '\0';
    ruser_local[1] = '\0';
    ruser_local[2] = '\0';
    ruser_local[3] = '\0';
    ruser_local[4] = '\0';
    ruser_local[5] = '\0';
    ruser_local[6] = '\0';
    ruser_local[7] = '\0';
    seat_notify_remote_exit(*(Seat **)(ruser_local + 0x20));
  }
  else if (spr.kind == SPRK_SW_ABORT) {
    sk_close(rlogin->s);
    ruser_local[0] = '\0';
    ruser_local[1] = '\0';
    ruser_local[2] = '\0';
    ruser_local[3] = '\0';
    ruser_local[4] = '\0';
    ruser_local[5] = '\0';
    ruser_local[6] = '\0';
    ruser_local[7] = '\0';
    auVar1 = spr._8_24_;
    spr_00._24_8_ = in_stack_ffffffffffffff88;
    spr_00.kind = auVar1._0_4_;
    spr_00._4_4_ = auVar1._4_4_;
    spr_00.errfn = (_func_void_SeatPromptResult_BinarySink_ptr *)auVar1._8_8_;
    spr_00.errdata_lit = (char *)auVar1._16_8_;
    pcVar2 = spr_get_error_message(spr_00);
    seat_connection_fatal(*(Seat **)(ruser_local + 0x20),"%s",pcVar2);
    safefree(pcVar2);
  }
  else {
    sk_write(rlogin->s,(void *)((long)&p + 7),1);
    pcVar2 = conf_get_str(*(Conf **)(ruser_local + 0x40),0x3b);
    pSVar5 = *(Socket **)ruser_local;
    sVar3 = strlen(pcVar2);
    sk_write(pSVar5,pcVar2,sVar3);
    sk_write(*(Socket **)ruser_local,(void *)((long)&p + 7),1);
    pcVar2 = pcStack_18;
    pSVar5 = *(Socket **)ruser_local;
    sVar3 = strlen(pcStack_18);
    sk_write(pSVar5,pcVar2,sVar3);
    sk_write(*(Socket **)ruser_local,(void *)((long)&p + 7),1);
    pcVar2 = conf_get_str(*(Conf **)(ruser_local + 0x40),0x35);
    pSVar5 = *(Socket **)ruser_local;
    sVar3 = strlen(pcVar2);
    sk_write(pSVar5,pcVar2,sVar3);
    sk_write(*(Socket **)ruser_local,"/",1);
    pcVar2 = conf_get_str(*(Conf **)(ruser_local + 0x40),0x36);
    pSVar5 = *(Socket **)ruser_local;
    sVar3 = strspn(pcVar2,"0123456789");
    sk_write(pSVar5,pcVar2,sVar3);
    sVar4 = sk_write(*(Socket **)ruser_local,(void *)((long)&p + 7),1);
    *(int *)(ruser_local + 0xc) = (int)sVar4;
  }
  ruser_local[0x48] = '\0';
  ruser_local[0x49] = '\0';
  ruser_local[0x4a] = '\0';
  ruser_local[0x4b] = '\0';
  ruser_local[0x4c] = '\0';
  ruser_local[0x4d] = '\0';
  ruser_local[0x4e] = '\0';
  ruser_local[0x4f] = '\0';
  if (*(long *)(ruser_local + 0x30) != 0) {
    ldisc_check_sendok(*(Ldisc **)(ruser_local + 0x30));
  }
  return;
}

Assistant:

static void rlogin_startup(Rlogin *rlogin, SeatPromptResult spr,
                           const char *ruser)
{
    char z = 0;
    char *p;

    if (spr.kind == SPRK_USER_ABORT) {
        /* User aborted at the username prompt. */
        sk_close(rlogin->s);
        rlogin->s = NULL;
        seat_notify_remote_exit(rlogin->seat);
    } else if (spr.kind == SPRK_SW_ABORT) {
        /* Something else went wrong at the username prompt, so we
         * have to show some kind of error. */
        sk_close(rlogin->s);
        rlogin->s = NULL;
        char *err = spr_get_error_message(spr);
        seat_connection_fatal(rlogin->seat, "%s", err);
        sfree(err);
    } else {
        sk_write(rlogin->s, &z, 1);
        p = conf_get_str(rlogin->conf, CONF_localusername);
        sk_write(rlogin->s, p, strlen(p));
        sk_write(rlogin->s, &z, 1);
        sk_write(rlogin->s, ruser, strlen(ruser));
        sk_write(rlogin->s, &z, 1);
        p = conf_get_str(rlogin->conf, CONF_termtype);
        sk_write(rlogin->s, p, strlen(p));
        sk_write(rlogin->s, "/", 1);
        p = conf_get_str(rlogin->conf, CONF_termspeed);
        sk_write(rlogin->s, p, strspn(p, "0123456789"));
        rlogin->bufsize = sk_write(rlogin->s, &z, 1);
    }

    rlogin->prompt = NULL;
    if (rlogin->ldisc)
        ldisc_check_sendok(rlogin->ldisc);
}